

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseParser.h
# Opt level: O2

void __thiscall phpconvert::BaseParser::File::~File(File *this)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  size_t sVar2;
  long lVar3;
  
  psVar1 = this->mainTypes;
  if (psVar1 != (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    sVar2 = psVar1[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (sVar2 != 0) {
      lVar3 = sVar2 * 0x30;
      do {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(&psVar1[-1]._M_t._M_impl.field_0x0 + lVar3));
        lVar3 = lVar3 + -0x30;
      } while (lVar3 != 0);
    }
    operator_delete__(&psVar1[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ::~vector(&this->prepTypesMain);
  std::
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ::~vector(&this->prepTypes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->types);
  std::__cxx11::string::~string((string *)&this->content);
  std::__cxx11::string::~string((string *)&this->firstMainTypeFull);
  std::__cxx11::string::~string((string *)&this->mainType);
  std::__cxx11::string::~string((string *)&this->namespaceName);
  std::__cxx11::string::~string((string *)&this->rootPath);
  std::__cxx11::string::~string((string *)&this->fullPath);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~File(){
                delete[] mainTypes;
            }